

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

void __thiscall flatbuffers::Parser::Serialize(Parser *this)

{
  value_type *pvVar1;
  value_type vVar2;
  bool bVar3;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>_> OVar4;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>_> OVar5;
  Offset<flatbuffers::String> OVar6;
  Offset<reflection::Schema> root;
  reference ppSVar7;
  reference ppEVar8;
  reference ppSVar9;
  ulong uVar10;
  pointer ppVar11;
  pointer pIVar12;
  char *pcVar13;
  string_view sVar14;
  offset_type local_2f4;
  Offset<reflection::Object> local_248;
  Offset<flatbuffers::String> local_244;
  Offset<flatbuffers::String> local_240;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>_> local_23c;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>_> local_238;
  offset_type local_234;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_> local_230;
  Offset<reflection::Schema> schema_offset;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int>_> serv__;
  Offset<flatbuffers::String> fext__;
  Offset<flatbuffers::String> fiid__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>_> enum__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>_> objs__;
  value_type local_208;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_204;
  _Self _Stack_200;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  included_files__;
  string local_1f8;
  string_view local_1d8;
  value_type local_1c4;
  _Self local_1c0;
  _Self local_1b8;
  iterator i;
  iterator iStack_178;
  Offset<flatbuffers::String> filename__;
  _Self local_170;
  iterator f;
  vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
  included_files;
  vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
  schema_files;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_>
  schema_files__;
  string *file_2;
  iterator iStack_110;
  Offset<reflection::Service> offset_2;
  __normal_iterator<flatbuffers::ServiceDef_**,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
  local_108;
  iterator it_2;
  vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  service_offsets;
  string *file_1;
  iterator iStack_c8;
  Offset<reflection::Enum> offset_1;
  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_c0;
  iterator it_1;
  vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  enum_offsets;
  string *file;
  value_type local_74;
  iterator iStack_70;
  Offset<reflection::Object> offset;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_68;
  iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  object_offsets;
  Parser *this_local;
  
  FlatBufferBuilderImpl<false>::Clear(&this->builder_);
  anon_unknown_0::AssignIndices<flatbuffers::StructDef>(&(this->structs_).vec);
  anon_unknown_0::AssignIndices<flatbuffers::EnumDef>(&(this->enums_).vec);
  std::
  vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  ::vector((vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
            *)&files._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&it);
  local_68._M_current =
       (StructDef **)
       std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                 (&(this->structs_).vec);
  while( true ) {
    iStack_70 = std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                end(&(this->structs_).vec);
    bVar3 = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff90);
    if (!bVar3) break;
    ppSVar7 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_68);
    local_74.o = (offset_type)StructDef::Serialize(*ppSVar7,&this->builder_,this);
    std::
    vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
    ::push_back((vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
                 *)&files._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_74);
    vVar2.o = local_74.o;
    ppSVar7 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_68);
    ((*ppSVar7)->super_Definition).serialized_location = vVar2.o;
    ppSVar7 = __gnu_cxx::
              __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
              ::operator*(&local_68);
    pvVar1 = ((*ppSVar7)->super_Definition).declaration_file;
    if (pvVar1 != (value_type *)0x0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it,pvVar1);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
    ::operator++(&local_68);
  }
  std::
  vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  ::vector((vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
            *)&it_1);
  local_c0._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&(this->enums_).vec);
  while( true ) {
    iStack_c8 = std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                          (&(this->enums_).vec);
    bVar3 = __gnu_cxx::operator!=(&local_c0,&stack0xffffffffffffff38);
    if (!bVar3) break;
    ppEVar8 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_c0);
    file_1._4_4_ = EnumDef::Serialize(*ppEVar8,&this->builder_,this);
    std::
    vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
    ::push_back((vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
                 *)&it_1,(value_type *)((long)&file_1 + 4));
    ppEVar8 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_c0);
    pvVar1 = ((*ppEVar8)->super_Definition).declaration_file;
    if (pvVar1 != (value_type *)0x0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it,pvVar1);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_c0);
  }
  std::
  vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  ::vector((vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
            *)&it_2);
  local_108._M_current =
       (ServiceDef **)
       std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::begin
                 (&(this->services_).vec);
  while( true ) {
    iStack_110 = std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>
                 ::end(&(this->services_).vec);
    bVar3 = __gnu_cxx::operator!=(&local_108,&stack0xfffffffffffffef0);
    if (!bVar3) break;
    ppSVar9 = __gnu_cxx::
              __normal_iterator<flatbuffers::ServiceDef_**,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
              ::operator*(&local_108);
    file_2._4_4_ = ServiceDef::Serialize(*ppSVar9,&this->builder_,this);
    std::
    vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
    ::push_back((vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
                 *)&it_2,(value_type *)((long)&file_2 + 4));
    ppSVar9 = __gnu_cxx::
              __normal_iterator<flatbuffers::ServiceDef_**,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
              ::operator*(&local_108);
    pvVar1 = ((*ppSVar9)->super_Definition).declaration_file;
    if (pvVar1 != (value_type *)0x0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&it,pvVar1);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::ServiceDef_**,_std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>_>
    ::operator++(&local_108);
  }
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_>::Offset
            ((Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int>_>
              *)((long)&schema_files.
                        super__Vector_base<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  uVar10 = std::__cxx11::string::empty();
  if ((uVar10 & 1) == 0) {
    std::
    vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
    ::vector((vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
              *)&included_files.
                 super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ::vector((vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
              *)&f);
    local_170._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
         ::begin(&this->files_included_per_file_);
    while( true ) {
      iStack_178 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                   ::end(&this->files_included_per_file_);
      bVar3 = std::operator!=(&local_170,&stack0xfffffffffffffe88);
      if (!bVar3) break;
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>
                ::operator->(&local_170);
      FilePath((string *)&i,&(this->opts).project_root,&ppVar11->first,
               (bool)((this->opts).binary_schema_absolute_paths & 1));
      sVar14 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&i);
      OVar6 = FlatBufferBuilderImpl<false>::CreateSharedString(&this->builder_,sVar14);
      std::__cxx11::string::~string((string *)&i);
      ppVar11 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>
                ::operator->(&local_170);
      local_1b8._M_node =
           (_Base_ptr)
           std::
           set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
           ::begin(&ppVar11->second);
      while( true ) {
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>
                  ::operator->(&local_170);
        local_1c0._M_node =
             (_Base_ptr)
             std::
             set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
             ::end(&ppVar11->second);
        bVar3 = std::operator!=(&local_1b8,&local_1c0);
        if (!bVar3) break;
        pIVar12 = std::_Rb_tree_const_iterator<flatbuffers::IncludedFile>::operator->(&local_1b8);
        FilePath(&local_1f8,&(this->opts).project_root,&pIVar12->filename,
                 (bool)((this->opts).binary_schema_absolute_paths & 1));
        sVar14 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1f8);
        local_1d8 = sVar14;
        local_1c4.o = (offset_type)
                      FlatBufferBuilderImpl<false>::CreateSharedString(&this->builder_,sVar14);
        std::
        vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
        ::push_back((vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
                     *)&f,&local_1c4);
        std::__cxx11::string::~string((string *)&local_1f8);
        _Stack_200 = std::_Rb_tree_const_iterator<flatbuffers::IncludedFile>::operator++
                               (&local_1b8,0);
      }
      local_204 = FlatBufferBuilderImpl<false>::
                  CreateVector<flatbuffers::Offset<flatbuffers::String>,std::allocator<flatbuffers::Offset<flatbuffers::String>>>
                            (&this->builder_,
                             (vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
                              *)&f);
      std::
      vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
      ::clear((vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
               *)&f);
      local_208.o = (offset_type)reflection::CreateSchemaFile(&this->builder_,OVar6,local_204);
      std::
      vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
      ::push_back((vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
                   *)&included_files.
                      super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_208);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>
      ::operator++(&local_170,0);
    }
    schema_files.
    super__Vector_base<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         FlatBufferBuilderImpl<false>::
         CreateVectorOfSortedTables<reflection::SchemaFile,std::allocator<flatbuffers::Offset<reflection::SchemaFile>>>
                   (&this->builder_,
                    (vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
                     *)&included_files.
                        super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ::~vector((vector<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
               *)&f);
    std::
    vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
    ::~vector((vector<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
               *)&included_files.
                  super__Vector_base<flatbuffers::Offset<flatbuffers::String>,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  OVar4 = FlatBufferBuilderImpl<false>::
          CreateVectorOfSortedTables<reflection::Object,std::allocator<flatbuffers::Offset<reflection::Object>>>
                    (&this->builder_,
                     (vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
                      *)&files._M_t._M_impl.super__Rb_tree_header._M_node_count);
  OVar5 = FlatBufferBuilderImpl<false>::
          CreateVectorOfSortedTables<reflection::Enum,std::allocator<flatbuffers::Offset<reflection::Enum>>>
                    (&this->builder_,
                     (vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
                      *)&it_1);
  OVar6 = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                    (&this->builder_,&this->file_identifier_);
  schema_offset.o =
       (offset_type)
       FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                 (&this->builder_,&this->file_extension_);
  local_230 = FlatBufferBuilderImpl<false>::
              CreateVectorOfSortedTables<reflection::Service,std::allocator<flatbuffers::Offset<reflection::Service>>>
                        (&this->builder_,
                         (vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
                          *)&it_2);
  local_244.o = schema_offset.o;
  if (this->root_struct_def_ == (StructDef *)0x0) {
    local_2f4 = 0;
  }
  else {
    local_2f4 = (this->root_struct_def_->super_Definition).serialized_location;
  }
  local_240 = OVar6;
  local_23c = OVar5;
  local_238 = OVar4;
  Offset<reflection::Object>::Offset(&local_248,local_2f4);
  root = reflection::CreateSchema
                   (&this->builder_,local_238,local_23c,local_240,local_244,local_248,local_230,
                    (AdvancedFeatures)this->advanced_features_,
                    schema_files.
                    super__Vector_base<flatbuffers::Offset<reflection::SchemaFile>,_std::allocator<flatbuffers::Offset<reflection::SchemaFile>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  local_234 = root.o;
  if (((this->opts).size_prefixed & 1U) == 0) {
    pcVar13 = reflection::SchemaIdentifier();
    FlatBufferBuilderImpl<false>::Finish<reflection::Schema>(&this->builder_,root,pcVar13);
  }
  else {
    pcVar13 = reflection::SchemaIdentifier();
    FlatBufferBuilderImpl<false>::FinishSizePrefixed<reflection::Schema>
              (&this->builder_,root,pcVar13);
  }
  std::
  vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
  ::~vector((vector<flatbuffers::Offset<reflection::Service>,_std::allocator<flatbuffers::Offset<reflection::Service>_>_>
             *)&it_2);
  std::
  vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
  ::~vector((vector<flatbuffers::Offset<reflection::Enum>,_std::allocator<flatbuffers::Offset<reflection::Enum>_>_>
             *)&it_1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&it);
  std::
  vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
  ::~vector((vector<flatbuffers::Offset<reflection::Object>,_std::allocator<flatbuffers::Offset<reflection::Object>_>_>
             *)&files._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void Parser::Serialize() {
  builder_.Clear();
  AssignIndices(structs_.vec);
  AssignIndices(enums_.vec);
  std::vector<Offset<reflection::Object>> object_offsets;
  std::set<std::string> files;
  for (auto it = structs_.vec.begin(); it != structs_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    object_offsets.push_back(offset);
    (*it)->serialized_location = offset.o;
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }
  std::vector<Offset<reflection::Enum>> enum_offsets;
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    enum_offsets.push_back(offset);
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }
  std::vector<Offset<reflection::Service>> service_offsets;
  for (auto it = services_.vec.begin(); it != services_.vec.end(); ++it) {
    auto offset = (*it)->Serialize(&builder_, *this);
    service_offsets.push_back(offset);
    const std::string *file = (*it)->declaration_file;
    if (file) files.insert(*file);
  }

  // Create Schemafiles vector of tables.
  flatbuffers::Offset<
      flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>>>
      schema_files__;
  if (!opts.project_root.empty()) {
    std::vector<Offset<reflection::SchemaFile>> schema_files;
    std::vector<Offset<flatbuffers::String>> included_files;
    for (auto f = files_included_per_file_.begin();
         f != files_included_per_file_.end(); f++) {

      const auto filename__ = builder_.CreateSharedString(FilePath(
          opts.project_root, f->first, opts.binary_schema_absolute_paths));
      for (auto i = f->second.begin(); i != f->second.end(); i++) {
        included_files.push_back(builder_.CreateSharedString(
            FilePath(opts.project_root, i->filename, opts.binary_schema_absolute_paths)));
      }
      const auto included_files__ = builder_.CreateVector(included_files);
      included_files.clear();

      schema_files.push_back(
          reflection::CreateSchemaFile(builder_, filename__, included_files__));
    }
    schema_files__ = builder_.CreateVectorOfSortedTables(&schema_files);
  }

  const auto objs__ = builder_.CreateVectorOfSortedTables(&object_offsets);
  const auto enum__ = builder_.CreateVectorOfSortedTables(&enum_offsets);
  const auto fiid__ = builder_.CreateString(file_identifier_);
  const auto fext__ = builder_.CreateString(file_extension_);
  const auto serv__ = builder_.CreateVectorOfSortedTables(&service_offsets);
  const auto schema_offset = reflection::CreateSchema(
      builder_, objs__, enum__, fiid__, fext__,
      (root_struct_def_ ? root_struct_def_->serialized_location : 0), serv__,
      static_cast<reflection::AdvancedFeatures>(advanced_features_),
      schema_files__);
  if (opts.size_prefixed) {
    builder_.FinishSizePrefixed(schema_offset, reflection::SchemaIdentifier());
  } else {
    builder_.Finish(schema_offset, reflection::SchemaIdentifier());
  }
}